

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.h
# Opt level: O3

bool operator==(CExtPubKey *a,CExtPubKey *b)

{
  bool bVar1;
  long in_FS_OFFSET;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  
  if ((((a->nDepth == b->nDepth) && (*(int *)a->vchFingerprint == *(int *)b->vchFingerprint)) &&
      (a->nChild == b->nChild)) &&
     (auVar3[0] = -((b->chaincode).super_base_blob<256U>.m_data._M_elems[0] ==
                   (a->chaincode).super_base_blob<256U>.m_data._M_elems[0]),
     auVar3[1] = -((b->chaincode).super_base_blob<256U>.m_data._M_elems[1] ==
                  (a->chaincode).super_base_blob<256U>.m_data._M_elems[1]),
     auVar3[2] = -((b->chaincode).super_base_blob<256U>.m_data._M_elems[2] ==
                  (a->chaincode).super_base_blob<256U>.m_data._M_elems[2]),
     auVar3[3] = -((b->chaincode).super_base_blob<256U>.m_data._M_elems[3] ==
                  (a->chaincode).super_base_blob<256U>.m_data._M_elems[3]),
     auVar3[4] = -((b->chaincode).super_base_blob<256U>.m_data._M_elems[4] ==
                  (a->chaincode).super_base_blob<256U>.m_data._M_elems[4]),
     auVar3[5] = -((b->chaincode).super_base_blob<256U>.m_data._M_elems[5] ==
                  (a->chaincode).super_base_blob<256U>.m_data._M_elems[5]),
     auVar3[6] = -((b->chaincode).super_base_blob<256U>.m_data._M_elems[6] ==
                  (a->chaincode).super_base_blob<256U>.m_data._M_elems[6]),
     auVar3[7] = -((b->chaincode).super_base_blob<256U>.m_data._M_elems[7] ==
                  (a->chaincode).super_base_blob<256U>.m_data._M_elems[7]),
     auVar3[8] = -((b->chaincode).super_base_blob<256U>.m_data._M_elems[8] ==
                  (a->chaincode).super_base_blob<256U>.m_data._M_elems[8]),
     auVar3[9] = -((b->chaincode).super_base_blob<256U>.m_data._M_elems[9] ==
                  (a->chaincode).super_base_blob<256U>.m_data._M_elems[9]),
     auVar3[10] = -((b->chaincode).super_base_blob<256U>.m_data._M_elems[10] ==
                   (a->chaincode).super_base_blob<256U>.m_data._M_elems[10]),
     auVar3[0xb] = -((b->chaincode).super_base_blob<256U>.m_data._M_elems[0xb] ==
                    (a->chaincode).super_base_blob<256U>.m_data._M_elems[0xb]),
     auVar3[0xc] = -((b->chaincode).super_base_blob<256U>.m_data._M_elems[0xc] ==
                    (a->chaincode).super_base_blob<256U>.m_data._M_elems[0xc]),
     auVar3[0xd] = -((b->chaincode).super_base_blob<256U>.m_data._M_elems[0xd] ==
                    (a->chaincode).super_base_blob<256U>.m_data._M_elems[0xd]),
     auVar3[0xe] = -((b->chaincode).super_base_blob<256U>.m_data._M_elems[0xe] ==
                    (a->chaincode).super_base_blob<256U>.m_data._M_elems[0xe]),
     auVar3[0xf] = -((b->chaincode).super_base_blob<256U>.m_data._M_elems[0xf] ==
                    (a->chaincode).super_base_blob<256U>.m_data._M_elems[0xf]),
     auVar2[0] = -((b->chaincode).super_base_blob<256U>.m_data._M_elems[0x10] ==
                  (a->chaincode).super_base_blob<256U>.m_data._M_elems[0x10]),
     auVar2[1] = -((b->chaincode).super_base_blob<256U>.m_data._M_elems[0x11] ==
                  (a->chaincode).super_base_blob<256U>.m_data._M_elems[0x11]),
     auVar2[2] = -((b->chaincode).super_base_blob<256U>.m_data._M_elems[0x12] ==
                  (a->chaincode).super_base_blob<256U>.m_data._M_elems[0x12]),
     auVar2[3] = -((b->chaincode).super_base_blob<256U>.m_data._M_elems[0x13] ==
                  (a->chaincode).super_base_blob<256U>.m_data._M_elems[0x13]),
     auVar2[4] = -((b->chaincode).super_base_blob<256U>.m_data._M_elems[0x14] ==
                  (a->chaincode).super_base_blob<256U>.m_data._M_elems[0x14]),
     auVar2[5] = -((b->chaincode).super_base_blob<256U>.m_data._M_elems[0x15] ==
                  (a->chaincode).super_base_blob<256U>.m_data._M_elems[0x15]),
     auVar2[6] = -((b->chaincode).super_base_blob<256U>.m_data._M_elems[0x16] ==
                  (a->chaincode).super_base_blob<256U>.m_data._M_elems[0x16]),
     auVar2[7] = -((b->chaincode).super_base_blob<256U>.m_data._M_elems[0x17] ==
                  (a->chaincode).super_base_blob<256U>.m_data._M_elems[0x17]),
     auVar2[8] = -((b->chaincode).super_base_blob<256U>.m_data._M_elems[0x18] ==
                  (a->chaincode).super_base_blob<256U>.m_data._M_elems[0x18]),
     auVar2[9] = -((b->chaincode).super_base_blob<256U>.m_data._M_elems[0x19] ==
                  (a->chaincode).super_base_blob<256U>.m_data._M_elems[0x19]),
     auVar2[10] = -((b->chaincode).super_base_blob<256U>.m_data._M_elems[0x1a] ==
                   (a->chaincode).super_base_blob<256U>.m_data._M_elems[0x1a]),
     auVar2[0xb] = -((b->chaincode).super_base_blob<256U>.m_data._M_elems[0x1b] ==
                    (a->chaincode).super_base_blob<256U>.m_data._M_elems[0x1b]),
     auVar2[0xc] = -((b->chaincode).super_base_blob<256U>.m_data._M_elems[0x1c] ==
                    (a->chaincode).super_base_blob<256U>.m_data._M_elems[0x1c]),
     auVar2[0xd] = -((b->chaincode).super_base_blob<256U>.m_data._M_elems[0x1d] ==
                    (a->chaincode).super_base_blob<256U>.m_data._M_elems[0x1d]),
     auVar2[0xe] = -((b->chaincode).super_base_blob<256U>.m_data._M_elems[0x1e] ==
                    (a->chaincode).super_base_blob<256U>.m_data._M_elems[0x1e]),
     auVar2[0xf] = -((b->chaincode).super_base_blob<256U>.m_data._M_elems[0x1f] ==
                    (a->chaincode).super_base_blob<256U>.m_data._M_elems[0x1f]),
     auVar2 = auVar2 & auVar3,
     (ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar2 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar2 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar2 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar2 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar2 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar2 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar2 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar2 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar2 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar2 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar2 >> 0x77,0) & 1) << 0xe |
             (ushort)(byte)(auVar2[0xf] >> 7) << 0xf) == 0xffff)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
      bVar1 = operator==(&a->pubkey,&b->pubkey);
      return bVar1;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return false;
  }
  __stack_chk_fail();
}

Assistant:

bool operator==(const CExtPubKey &a, const CExtPubKey &b)
    {
        return a.nDepth == b.nDepth &&
            memcmp(a.vchFingerprint, b.vchFingerprint, sizeof(vchFingerprint)) == 0 &&
            a.nChild == b.nChild &&
            a.chaincode == b.chaincode &&
            a.pubkey == b.pubkey;
    }